

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<Flood_Four_Test>::CreateTest
          (TestFactoryImpl<Flood_Four_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<Flood_Four_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  Flood_Four_Test::Flood_Four_Test((Flood_Four_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }